

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

char * __thiscall cmTarget::GetSuffixVariableInternal(cmTarget *this,ArtifactType artifact)

{
  TargetType TVar1;
  char *pcVar2;
  bool bVar3;
  bool local_75;
  allocator<char> local_41;
  string local_40;
  ArtifactType local_1c;
  cmTarget *pcStack_18;
  ArtifactType artifact_local;
  cmTarget *this_local;
  
  local_1c = artifact;
  pcStack_18 = this;
  TVar1 = GetType(this);
  switch(TVar1) {
  case EXECUTABLE:
    if (local_1c == RuntimeBinaryArtifact) {
      bVar3 = (this->IsAndroid & 1U) != 0;
      local_75 = false;
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"ANDROID_GUI",&local_41);
        local_75 = GetPropertyAsBool(this,&local_40);
      }
      pcVar2 = "CMAKE_EXECUTABLE_SUFFIX";
      if (local_75 != false) {
        pcVar2 = "CMAKE_SHARED_LIBRARY_SUFFIX";
      }
      if (!bVar3) {
        return &((cmTarget *)pcVar2)->IsGeneratorProvided;
      }
      this_local = (cmTarget *)pcVar2;
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
      return &this_local->IsGeneratorProvided;
    }
    if (local_1c == ImportLibraryArtifact) {
      this_local = (cmTarget *)anon_var_dwarf_270853;
      return &this_local->IsGeneratorProvided;
    }
    break;
  case STATIC_LIBRARY:
    this_local = (cmTarget *)anon_var_dwarf_4ea0e2;
    return &this_local->IsGeneratorProvided;
  case SHARED_LIBRARY:
    if (local_1c == RuntimeBinaryArtifact) {
      this_local = (cmTarget *)anon_var_dwarf_4ea0ee;
      return &this_local->IsGeneratorProvided;
    }
    if (local_1c == ImportLibraryArtifact) {
      this_local = (cmTarget *)anon_var_dwarf_270853;
      return &this_local->IsGeneratorProvided;
    }
    break;
  case MODULE_LIBRARY:
    if (local_1c == RuntimeBinaryArtifact) {
      this_local = (cmTarget *)anon_var_dwarf_2d58f4;
      return &this_local->IsGeneratorProvided;
    }
    if (local_1c == ImportLibraryArtifact) {
      this_local = (cmTarget *)anon_var_dwarf_270853;
      return &this_local->IsGeneratorProvided;
    }
  }
  this_local = (cmTarget *)0x76e680;
  return &this_local->IsGeneratorProvided;
}

Assistant:

const char* cmTarget::GetSuffixVariableInternal(
  cmStateEnums::ArtifactType artifact) const
{
  switch (this->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      return "CMAKE_STATIC_LIBRARY_SUFFIX";
    case cmStateEnums::SHARED_LIBRARY:
      switch (artifact) {
        case cmStateEnums::RuntimeBinaryArtifact:
          return "CMAKE_SHARED_LIBRARY_SUFFIX";
        case cmStateEnums::ImportLibraryArtifact:
          return "CMAKE_IMPORT_LIBRARY_SUFFIX";
      }
      break;
    case cmStateEnums::MODULE_LIBRARY:
      switch (artifact) {
        case cmStateEnums::RuntimeBinaryArtifact:
          return "CMAKE_SHARED_MODULE_SUFFIX";
        case cmStateEnums::ImportLibraryArtifact:
          return "CMAKE_IMPORT_LIBRARY_SUFFIX";
      }
      break;
    case cmStateEnums::EXECUTABLE:
      switch (artifact) {
        case cmStateEnums::RuntimeBinaryArtifact:
          // Android GUI application packages store the native
          // binary as a shared library.
          return (this->IsAndroid && this->GetPropertyAsBool("ANDROID_GUI")
                    ? "CMAKE_SHARED_LIBRARY_SUFFIX"
                    : "CMAKE_EXECUTABLE_SUFFIX");
        case cmStateEnums::ImportLibraryArtifact:
          return "CMAKE_IMPORT_LIBRARY_SUFFIX";
      }
      break;
    default:
      break;
  }
  return "";
}